

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_animatable_default<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,Animatable<std::array<float,_2UL>_> *v,
          uint32_t indent)

{
  array<float,_2UL> a;
  stringstream ss;
  float2 local_1a0;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  if (this[9] == (tinyusdz)0x1) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_188,"None",4);
  }
  if (this[8] == (tinyusdz)0x1) {
    if (this[9] != (tinyusdz)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]","");
      goto LAB_0031bbb0;
    }
    local_1a0._M_elems = *(_Type *)this;
    ::std::operator<<(local_188,&local_1a0);
  }
  ::std::__cxx11::stringbuf::str();
LAB_0031bbb0:
  ::std::__cxx11::stringstream::~stringstream(local_198);
  ::std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}